

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_short>::rayTest
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *rayFrom,btVector3 *rayTo,
          btBroadphaseRayCallback *rayCallback,btVector3 *aabbMin,btVector3 *aabbMax)

{
  uint uVar1;
  ulong uVar2;
  
  if (this->m_raycastAccelerator != (btDbvtBroadphase *)0x0) {
    (*(this->m_raycastAccelerator->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[6])();
    return;
  }
  if (this->m_numHandles != 0) {
    uVar2 = 1;
    do {
      uVar2 = uVar2 & 0xffff;
      if ((this->m_pEdges[0][uVar2].m_pos & 1) != 0) {
        (*(rayCallback->super_btBroadphaseAabbCallback)._vptr_btBroadphaseAabbCallback[2])
                  (rayCallback,
                   (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                   ((ulong)((uint)this->m_pEdges[0][uVar2].m_handle * 0x50) - 0x1c));
      }
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while ((uVar1 & 0xffff) <= (uint)this->m_numHandles * 2);
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::rayTest(const btVector3& rayFrom,const btVector3& rayTo, btBroadphaseRayCallback& rayCallback,const btVector3& aabbMin,const btVector3& aabbMax)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->rayTest(rayFrom,rayTo,rayCallback,aabbMin,aabbMax);
	} else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i=1;i<m_numHandles*2+1;i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				rayCallback.process(getHandle(m_pEdges[axis][i].m_handle));
			}
		}
	}
}